

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9150.cpp
# Opt level: O1

bool __thiscall RTIMUMPU9150::IMURead(RTIMUMPU9150 *this)

{
  RTIMU_DATA *pRVar1;
  int *piVar2;
  RTFLOAT RVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  bool bVar8;
  ushort uVar9;
  uint64_t uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  uchar *rawData;
  uint uVar15;
  RTFLOAT RVar16;
  uchar fifoCount [2];
  uchar compassData [8];
  uchar fifoData [12];
  ushort local_3a;
  undefined8 local_38;
  undefined8 local_30;
  undefined4 local_28;
  
  bVar8 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,'r',
                            '\x02',(uchar *)&local_3a,"Failed to read fifo count");
  if (!bVar8) goto LAB_0011be31;
  uVar9 = local_3a << 8 | local_3a >> 8;
  if (uVar9 == 0x400) {
    iVar11 = 0;
    printf("%s","MPU9150 fifo has overflowed");
    fflush(_stdout);
    resetFifo(this);
    pRVar1 = &(this->super_RTIMU).m_imuData;
    pRVar1->timestamp = pRVar1->timestamp + (this->super_RTIMU).m_sampleInterval * 0x56;
    goto LAB_0011be33;
  }
  if (uVar9 - 0xc < 0xb4 && this->m_cacheCount == 0) {
    bVar8 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                              't','\f',(uchar *)&local_30,"Failed to read fifo data");
    if ((bVar8) &&
       (bVar8 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                  this->m_slaveAddr,'I',(uchar)this->m_compassDataLength,
                                  (uchar *)&local_38,"Failed to read compass data"), bVar8)) {
LAB_0011bdda:
      RTMath::convertToVector
                ((uchar *)&local_30,&(this->super_RTIMU).m_imuData.accel,this->m_accelScale,true);
      RTMath::convertToVector
                ((uchar *)((long)&local_30 + 6),&(this->super_RTIMU).m_imuData.gyro,
                 this->m_gyroScale,true);
      bVar8 = this->m_compassIs5883 != true;
      if (bVar8) {
        rawData = (uchar *)((long)&local_38 + 1);
        RVar16 = 0.3;
      }
      else {
        rawData = (uchar *)&local_38;
        RVar16 = 0.092;
      }
      RTMath::convertToVector(rawData,&(this->super_RTIMU).m_imuData.compass,RVar16,!bVar8);
      RVar16 = (this->super_RTIMU).m_imuData.gyro.m_data[2];
      RVar3 = (this->super_RTIMU).m_imuData.accel.m_data[0];
      (this->super_RTIMU).m_imuData.gyro.m_data[1] = -(this->super_RTIMU).m_imuData.gyro.m_data[1];
      (this->super_RTIMU).m_imuData.gyro.m_data[2] = -RVar16;
      (this->super_RTIMU).m_imuData.accel.m_data[0] = -RVar3;
      if (this->m_compassIs5883 == true) {
        RVar16 = (this->super_RTIMU).m_imuData.compass.m_data[1];
        (this->super_RTIMU).m_imuData.compass.m_data[1] =
             -(this->super_RTIMU).m_imuData.compass.m_data[2];
        (this->super_RTIMU).m_imuData.compass.m_data[2] = -RVar16;
      }
      else {
        fVar4 = (this->super_RTIMU).m_imuData.compass.m_data[0];
        fVar5 = (this->super_RTIMU).m_imuData.compass.m_data[1];
        fVar6 = this->m_compassAdjust[0];
        fVar7 = this->m_compassAdjust[1];
        (this->super_RTIMU).m_imuData.compass.m_data[2] =
             (this->super_RTIMU).m_imuData.compass.m_data[2] * this->m_compassAdjust[2];
        (this->super_RTIMU).m_imuData.compass.m_data[0] = fVar5 * fVar7;
        (this->super_RTIMU).m_imuData.compass.m_data[1] = -(fVar4 * fVar6);
      }
      RTIMU::handleGyroBias(&this->super_RTIMU);
      RTIMU::calibrateAverageCompass(&this->super_RTIMU);
      RTIMU::calibrateAccel(&this->super_RTIMU);
      if (this->m_firstTime == true) {
        uVar10 = RTMath::currentUSecsSinceEpoch();
      }
      else {
        uVar10 = (this->super_RTIMU).m_imuData.timestamp + (this->super_RTIMU).m_sampleInterval;
      }
      (this->super_RTIMU).m_imuData.timestamp = uVar10;
      this->m_firstTime = false;
      RTIMU::updateFusion(&this->super_RTIMU);
      iVar11 = 1;
      goto LAB_0011be33;
    }
  }
  else {
    if (0xbf < uVar9) {
      if (this->m_cacheCount == 0x10) {
        iVar11 = this->m_cacheOut;
        pRVar1 = &(this->super_RTIMU).m_imuData;
        pRVar1->timestamp =
             pRVar1->timestamp +
             (long)this->m_cache[iVar11].count * (this->super_RTIMU).m_sampleInterval;
        iVar11 = iVar11 + 1;
        iVar13 = 0;
        if (iVar11 != 0x10) {
          iVar13 = iVar11;
        }
        this->m_cacheOut = iVar13;
        this->m_cacheCount = 0xf;
      }
      uVar15 = 0x10;
      if (uVar9 / 0xc < 0x10) {
        uVar15 = uVar9 / 0xc;
      }
      bVar8 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                                't',(char)uVar15 * '\f',this->m_cache[this->m_cacheIn].data,
                                "Failed to read fifo data");
      if (!bVar8) goto LAB_0011be31;
      bVar8 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                                'I','\b',this->m_cache[this->m_cacheIn].compass,
                                "Failed to read compass data");
      iVar11 = 0;
      if (!bVar8) goto LAB_0011be33;
      iVar13 = this->m_cacheIn;
      this->m_cache[iVar13].count = uVar15;
      this->m_cache[iVar13].index = 0;
      this->m_cacheCount = this->m_cacheCount + 1;
      if (iVar13 + 1 != 0x10) {
        iVar11 = iVar13 + 1;
      }
      this->m_cacheIn = iVar11;
    }
    iVar11 = this->m_cacheCount;
    if (iVar11 != 0) {
      iVar13 = this->m_cacheOut;
      lVar14 = (long)this->m_cache[iVar13].index;
      local_28 = *(undefined4 *)(this->m_cache[iVar13].data + lVar14 + 8);
      local_30 = *(undefined8 *)(this->m_cache[iVar13].data + lVar14);
      local_38 = *(undefined8 *)this->m_cache[iVar13].compass;
      piVar2 = &this->m_cache[iVar13].index;
      *piVar2 = *piVar2 + 0xc;
      piVar2 = &this->m_cache[iVar13].count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        iVar12 = 0;
        if (iVar13 + 1 != 0x10) {
          iVar12 = iVar13 + 1;
        }
        this->m_cacheOut = iVar12;
        this->m_cacheCount = iVar11 + -1;
      }
      goto LAB_0011bdda;
    }
  }
LAB_0011be31:
  iVar11 = 0;
LAB_0011be33:
  return SUB41(iVar11,0);
}

Assistant:

bool RTIMUMPU9150::IMURead()
{
    unsigned char fifoCount[2];
    unsigned int count;
    unsigned char fifoData[12];
    unsigned char compassData[8];

    if (!m_settings->HALRead(m_slaveAddr, MPU9150_FIFO_COUNT_H, 2, fifoCount, "Failed to read fifo count"))
         return false;

    count = ((unsigned int)fifoCount[0] << 8) + fifoCount[1];

    if (count == 1024) {
        HAL_INFO("MPU9150 fifo has overflowed");
        resetFifo();
        m_imuData.timestamp += m_sampleInterval * (1024 / MPU9150_FIFO_CHUNK_SIZE + 1); // try to fix timestamp
        return false;
    }


#ifdef MPU9150_CACHE_MODE
    if ((m_cacheCount == 0) && (count  >= MPU9150_FIFO_CHUNK_SIZE) && (count < (MPU9150_CACHE_SIZE * MPU9150_FIFO_CHUNK_SIZE))) {
        // special case of a small fifo and nothing cached - just handle as simple read

        if (!m_settings->HALRead(m_slaveAddr, MPU9150_FIFO_R_W, MPU9150_FIFO_CHUNK_SIZE, fifoData, "Failed to read fifo data"))
            return false;

        if (!m_settings->HALRead(m_slaveAddr, MPU9150_EXT_SENS_DATA_00, m_compassDataLength, compassData, "Failed to read compass data"))
            return false;
    } else {
        if (count >= (MPU9150_CACHE_SIZE * MPU9150_FIFO_CHUNK_SIZE)) {
            if (m_cacheCount == MPU9150_CACHE_BLOCK_COUNT) {
                // all cache blocks are full - discard oldest and update timestamp to account for lost samples
                m_imuData.timestamp += m_sampleInterval * m_cache[m_cacheOut].count;
                if (++m_cacheOut == MPU9150_CACHE_BLOCK_COUNT)
                    m_cacheOut = 0;
                m_cacheCount--;
            }

            int blockCount = count / MPU9150_FIFO_CHUNK_SIZE;   // number of chunks in fifo

            if (blockCount > MPU9150_CACHE_SIZE)
                blockCount = MPU9150_CACHE_SIZE;

            if (!m_settings->HALRead(m_slaveAddr, MPU9150_FIFO_R_W, MPU9150_FIFO_CHUNK_SIZE * blockCount,
                                m_cache[m_cacheIn].data, "Failed to read fifo data"))
                return false;

            if (!m_settings->HALRead(m_slaveAddr, MPU9150_EXT_SENS_DATA_00, 8, m_cache[m_cacheIn].compass, "Failed to read compass data"))
                return false;

            m_cache[m_cacheIn].count = blockCount;
            m_cache[m_cacheIn].index = 0;

            m_cacheCount++;
            if (++m_cacheIn == MPU9150_CACHE_BLOCK_COUNT)
                m_cacheIn = 0;

        }

        //  now fifo has been read if necessary, get something to process

        if (m_cacheCount == 0)
            return false;

        memcpy(fifoData, m_cache[m_cacheOut].data + m_cache[m_cacheOut].index, MPU9150_FIFO_CHUNK_SIZE);
        memcpy(compassData, m_cache[m_cacheOut].compass, 8);

        m_cache[m_cacheOut].index += MPU9150_FIFO_CHUNK_SIZE;

        if (--m_cache[m_cacheOut].count == 0) {
            //  this cache block is now empty

            if (++m_cacheOut == MPU9150_CACHE_BLOCK_COUNT)
                m_cacheOut = 0;
            m_cacheCount--;
        }
    }

#else

    if (count > MPU9150_FIFO_CHUNK_SIZE * 40) {
        // more than 40 samples behind - going too slowly so discard some samples but maintain timestamp correctly
        while (count >= MPU9150_FIFO_CHUNK_SIZE * 10) {
            if (!m_settings->HALRead(m_slaveAddr, MPU9150_FIFO_R_W, MPU9150_FIFO_CHUNK_SIZE, fifoData, "Failed to read fifo data"))
                return false;
            count -= MPU9150_FIFO_CHUNK_SIZE;
            m_imuData.timestamp += m_sampleInterval;
        }
    }

    if (count < MPU9150_FIFO_CHUNK_SIZE)
        return false;

    if (!m_settings->HALRead(m_slaveAddr, MPU9150_FIFO_R_W, MPU9150_FIFO_CHUNK_SIZE, fifoData, "Failed to read fifo data"))
        return false;

    if (!m_settings->HALRead(m_slaveAddr, MPU9150_EXT_SENS_DATA_00, m_compassDataLength, compassData, "Failed to read compass data"))
        return false;

#endif

    RTMath::convertToVector(fifoData, m_imuData.accel, m_accelScale, true);
    RTMath::convertToVector(fifoData + 6, m_imuData.gyro, m_gyroScale, true);

    if (m_compassIs5883)
        RTMath::convertToVector(compassData, m_imuData.compass, 0.092f, true);
    else
        RTMath::convertToVector(compassData + 1, m_imuData.compass, 0.3f, false);

    //  sort out gyro axes

    m_imuData.gyro.setX(m_imuData.gyro.x());
    m_imuData.gyro.setY(-m_imuData.gyro.y());
    m_imuData.gyro.setZ(-m_imuData.gyro.z());

    //  sort out accel data;

    m_imuData.accel.setX(-m_imuData.accel.x());


    if (m_compassIs5883) {
        //  sort out compass axes

        float temp;

        temp = m_imuData.compass.y();
        m_imuData.compass.setY(-m_imuData.compass.z());
        m_imuData.compass.setZ(-temp);

    } else {

        //  use the compass fuse data adjustments

        m_imuData.compass.setX(m_imuData.compass.x() * m_compassAdjust[0]);
        m_imuData.compass.setY(m_imuData.compass.y() * m_compassAdjust[1]);
        m_imuData.compass.setZ(m_imuData.compass.z() * m_compassAdjust[2]);

        //  sort out compass axes

        float temp;

        temp = m_imuData.compass.x();
        m_imuData.compass.setX(m_imuData.compass.y());
        m_imuData.compass.setY(-temp);
    }


    //  now do standard processing

    handleGyroBias();
    calibrateAverageCompass();
    calibrateAccel();

    if (m_firstTime)
        m_imuData.timestamp = RTMath::currentUSecsSinceEpoch();
    else
        m_imuData.timestamp += m_sampleInterval;

    m_firstTime = false;

    //  now update the filter

    updateFusion();

    return true;
}